

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O2

vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
* __thiscall
webfront::http::Response::toBuffers<webfront::networking::TCPNetworkingTS>
          (vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
           *__return_storage_ptr__,Response *this)

{
  pointer pHVar1;
  int iVar2;
  StatusCode code;
  Header *header;
  pointer pHVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Response *local_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&toBuffers<webfront::networking::TCPNetworkingTS>()::
                                 httpStatus_abi_cxx11_);
    if (iVar2 != 0) {
      toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_dataplus._M_p =
           (pointer)&toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_.
                     field_2;
      toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_string_length = 0
      ;
      toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_.field_2._M_local_buf
      [0] = '\0';
      __cxa_atexit(::std::__cxx11::string::~string,
                   &toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_
                         );
    }
  }
  std::__cxx11::to_string(&local_b0,(uint)this->statusCode);
  ::std::operator+(&local_90,"HTTP/1.1 ",&local_b0);
  ::std::operator+(&local_70,&local_90," ");
  toString_abi_cxx11_(&local_d0,(Response *)(ulong)this->statusCode,code);
  ::std::operator+(&local_50,&local_70,&local_d0);
  ::std::operator+(&local_f8,&local_50,"\r\n");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_,&local_f8);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_b0);
  local_f8._M_dataplus._M_p =
       (pointer)toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_.
                _M_string_length;
  if (toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_string_length !=
      0) {
    local_f8._M_dataplus =
         toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_dataplus;
  }
  local_f8._M_string_length =
       toBuffers<webfront::networking::TCPNetworkingTS>()::httpStatus_abi_cxx11_._M_string_length;
  std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::emplace_back<std::experimental::net::v1::const_buffer>
            (__return_storage_ptr__,(const_buffer *)&local_f8);
  pHVar1 = (this->super_Headers).headers.
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d8 = this;
  for (pHVar3 = (this->super_Headers).headers.
                super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
                ._M_impl.super__Vector_impl_data._M_start; pHVar3 != pHVar1; pHVar3 = pHVar3 + 1) {
    local_f8._M_string_length = (pHVar3->name)._M_string_length;
    local_f8._M_dataplus._M_p = (pointer)local_f8._M_string_length;
    if ((pointer)local_f8._M_string_length != (pointer)0x0) {
      local_f8._M_dataplus._M_p = (pHVar3->name)._M_dataplus._M_p;
    }
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::emplace_back<std::experimental::net::v1::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_f8);
    local_f8._M_dataplus._M_p = ": ";
    local_f8._M_string_length = 2;
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::emplace_back<std::experimental::net::v1::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_f8);
    local_f8._M_string_length = (pHVar3->value)._M_string_length;
    local_f8._M_dataplus._M_p = (pointer)local_f8._M_string_length;
    if ((pointer)local_f8._M_string_length != (pointer)0x0) {
      local_f8._M_dataplus._M_p = (pHVar3->value)._M_dataplus._M_p;
    }
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::emplace_back<std::experimental::net::v1::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_f8);
    local_f8._M_dataplus._M_p = "\r\n";
    local_f8._M_string_length = 2;
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::emplace_back<std::experimental::net::v1::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_f8);
  }
  local_f8._M_dataplus._M_p = "\r\n";
  local_f8._M_string_length = 2;
  std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::emplace_back<std::experimental::net::v1::const_buffer>
            (__return_storage_ptr__,(const_buffer *)&local_f8);
  local_f8._M_string_length = (local_d8->content)._M_string_length;
  if (local_f8._M_string_length != 0) {
    local_f8._M_dataplus._M_p = (local_d8->content)._M_dataplus._M_p;
    std::
    vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
    ::emplace_back<std::experimental::net::v1::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<typename Net::ConstBuffer> toBuffers() const {
        std::vector<typename Net::ConstBuffer> buffers;
        static std::string httpStatus;
        httpStatus = "HTTP/1.1 " + std::to_string(statusCode) + " " + toString(statusCode) + "\r\n";
        buffers.push_back(Net::Buffer(httpStatus));

        static const char separator[] = {':', ' '};
        static const char crlf[] = {'\r', '\n'};
        for (auto& header : headers) {
            buffers.push_back(Net::Buffer(header.name));
            buffers.push_back(Net::Buffer(separator));
            buffers.push_back(Net::Buffer(header.value));
            buffers.push_back(Net::Buffer(crlf));
        }
        buffers.push_back(Net::Buffer(crlf));
        if (!content.empty()) buffers.push_back(Net::Buffer(content));

        return buffers;
    }